

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

void duckdb_je_psset_insert(psset_t *psset,hpdata_t *ps)

{
  ps->h_in_psset = true;
  psset_stats_insert(psset,ps);
  if (ps->h_alloc_allowed == true) {
    psset_alloc_container_insert(psset,ps);
  }
  psset_maybe_insert_purge_list(psset,ps);
  if (ps->h_hugify_allowed == true) {
    ps->h_in_psset_hugify_container = true;
    hpdata_hugify_list_append(&psset->to_hugify,ps);
    return;
  }
  return;
}

Assistant:

void
psset_insert(psset_t *psset, hpdata_t *ps) {
	hpdata_in_psset_set(ps, true);

	psset_stats_insert(psset, ps);
	if (hpdata_alloc_allowed_get(ps)) {
		psset_alloc_container_insert(psset, ps);
	}
	psset_maybe_insert_purge_list(psset, ps);

	if (hpdata_hugify_allowed_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, true);
		hpdata_hugify_list_append(&psset->to_hugify, ps);
	}
}